

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.cpp
# Opt level: O0

void __thiscall
vmips::phi::phi(phi *this,shared_ptr<vmips::VirtReg> *op0,shared_ptr<vmips::VirtReg> *op1)

{
  shared_ptr<vmips::VirtReg> *op1_local;
  shared_ptr<vmips::VirtReg> *op0_local;
  phi *this_local;
  
  Instruction::Instruction(&this->super_Instruction);
  (this->super_Instruction)._vptr_Instruction = (_func_int **)&PTR_collect_register_001c1028;
  std::shared_ptr<vmips::VirtReg>::shared_ptr(&this->op0,op0);
  std::shared_ptr<vmips::VirtReg>::shared_ptr(&this->op1,op1);
  return;
}

Assistant:

phi::phi(std::shared_ptr<VirtReg> op0, std::shared_ptr<VirtReg> op1) : op0(std::move(op0)), op1(std::move(op1)) {

}